

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

bool Path::is_abspath(string *path)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  string *path_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::front();
    if (*pcVar2 == '/') {
      path_local._7_1_ = true;
    }
    else {
      lVar3 = std::__cxx11::string::find((char *)path,0x62969d);
      path_local._7_1_ = lVar3 != -1;
    }
  }
  else {
    path_local._7_1_ = false;
  }
  return path_local._7_1_;
}

Assistant:

bool is_abspath(const string &path)
{
	if (path.empty())
		return false;
	if (path.front() == '/')
		return true;

#ifdef _WIN32
	{
		auto index = (std::min)(path.find(":/"), path.find(":\\"));
		if (index != string::npos)
			return true;
	}
#endif

	return path.find("://") != string::npos;
}